

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

duration<long,_std::ratio<1L,_1000000L>_> __thiscall
absl::lts_20250127::time_internal::
ToChronoDuration<std::chrono::duration<long,std::ratio<1l,1000000l>>>
          (time_internal *this,Duration d)

{
  Duration lhs;
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  long lVar4;
  duration<long,_std::ratio<1L,_1000000L>_> dVar5;
  Duration DVar6;
  long local_a0;
  int64_t v;
  uint32_t local_90;
  HiRep local_88;
  uint32_t local_80;
  Duration local_78;
  HiRep local_64;
  uint32_t local_5c;
  HiRep local_58;
  uint32_t local_50;
  time_internal *local_48;
  uint32_t local_40;
  time_internal *local_38;
  uint32_t local_30;
  time_internal *local_2c;
  uint32_t local_24;
  HiRep local_1c;
  Duration d_local;
  
  local_40 = d.rep_hi_.lo_;
  DVar6.rep_lo_ = local_40;
  DVar6.rep_hi_ = (HiRep)this;
  local_48 = this;
  local_38 = this;
  local_30 = local_40;
  local_2c = this;
  local_24 = local_40;
  local_1c = (HiRep)this;
  d_local.rep_hi_.lo_ = local_40;
  bVar2 = IsInfiniteDuration(DVar6);
  if (bVar2) {
    local_50 = d_local.rep_hi_.lo_;
    local_58 = local_1c;
    DVar6 = ZeroDuration();
    local_78.rep_hi_ = DVar6.rep_hi_;
    local_64 = local_78.rep_hi_;
    local_78.rep_lo_ = DVar6.rep_lo_;
    local_5c = local_78.rep_lo_;
    local_88 = local_58;
    local_80 = local_50;
    lhs.rep_lo_ = local_50;
    lhs.rep_hi_ = local_58;
    v._0_4_ = local_78.rep_hi_.lo_;
    v._4_4_ = local_78.rep_hi_.hi_;
    local_90 = local_78.rep_lo_;
    local_78 = DVar6;
    bVar2 = lts_20250127::operator<(lhs,DVar6);
    if (bVar2) {
      d_local._4_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::min();
    }
    else {
      d_local._4_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::max();
    }
  }
  else {
    iVar3 = ToInt64(local_1c,d_local.rep_hi_.lo_);
    local_a0 = iVar3;
    lVar4 = std::numeric_limits<long>::max();
    lVar1 = local_a0;
    if (lVar4 < iVar3) {
      d_local._4_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::max();
    }
    else {
      lVar4 = std::numeric_limits<long>::min();
      if (lVar1 < lVar4) {
        d_local._4_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::min();
      }
      else {
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,void>
                  ((duration<long,std::ratio<1l,1000000l>> *)&d_local.rep_hi_.hi_,&local_a0);
      }
    }
  }
  dVar5.__r._0_4_ = d_local.rep_hi_.hi_;
  dVar5.__r._4_4_ = d_local.rep_lo_;
  return (duration<long,_std::ratio<1L,_1000000L>_>)dVar5.__r;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION T ToChronoDuration(Duration d) {
  using Rep = typename T::rep;
  using Period = typename T::period;
  static_assert(IsValidRep64<Rep>(0), "duration::rep is invalid");
  if (time_internal::IsInfiniteDuration(d))
    return d < ZeroDuration() ? (T::min)() : (T::max)();
  const auto v = ToInt64(d, Period{});
  if (v > (std::numeric_limits<Rep>::max)()) return (T::max)();
  if (v < (std::numeric_limits<Rep>::min)()) return (T::min)();
  return T{v};
}